

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_tdup(ASMState *as,IRIns *ir)

{
  RegCost RVar1;
  ASMState *in_RSI;
  long in_RDI;
  IRRef args [2];
  CCallInfo *ci;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  IRIns *ir_00;
  
  ir_00 = (IRIns *)(lj_ir_callinfo + 0x1b);
  asm_snap_prep((ASMState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  RVar1 = in_RSI->cost[0];
  *(int *)(in_RDI + 0x10c) = *(int *)(in_RDI + 0x10c) + 1;
  asm_setupresult(in_RSI,ir_00,(CCallInfo *)(ulong)CONCAT24((short)RVar1,0x7fff));
  asm_gencall((ASMState *)&ir->field_0,ci,(IRRef *)args);
  return;
}

Assistant:

static void asm_tdup(ASMState *as, IRIns *ir)
{
  const CCallInfo *ci = &lj_ir_callinfo[IRCALL_lj_tab_dup];
  IRRef args[2];
  asm_snap_prep(as);
  args[0] = ASMREF_L;  /* lua_State *L    */
  args[1] = ir->op1;   /* const GCtab *kt */
  as->gcsteps++;
  asm_setupresult(as, ir, ci);  /* GCtab * */
  asm_gencall(as, ci, args);
}